

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  char *buf;
  int iVar1;
  xmlOutputBufferPtr out;
  xmlOutputBufferPtr out_00;
  _xmlDoc *p_Var2;
  long lVar3;
  xmlNode *node;
  _xmlNode *p_Var4;
  xmlDocPtr pxVar5;
  _xmlDtd *p_Var6;
  _xmlDtd *p_Var7;
  _xmlDtd *p_Var8;
  char cVar9;
  int iVar10;
  xmlNodePtr pxVar11;
  xmlChar *pxVar12;
  _xmlNode **pp_Var13;
  int *piVar14;
  char *pcVar15;
  _xmlDtd *p_Var16;
  _xmlDtd *p_Var17;
  _xmlDtd *p_Var18;
  xmlDocPtr cur_00;
  _xmlNode **pp_Var19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  xmlDocPtr local_68;
  _xmlDtd *local_60;
  _xmlDtd *local_50;
  _xmlDtd *local_40;
  
  iVar1 = ctxt->format;
  out = ctxt->buf;
  buf = ctxt->indent;
  local_68 = (xmlDocPtr)0x0;
  pxVar5 = (xmlDocPtr)cur;
LAB_001a6779:
  cur_00 = pxVar5;
  switch(cur_00->type) {
  case XML_ELEMENT_NODE:
    if (((cur_00 != (xmlDocPtr)cur) && (ctxt->format == 1)) &&
       (piVar14 = __xmlIndentTreeOutput(), *piVar14 != 0)) {
      iVar10 = ctxt->indent_nr;
      if (ctxt->level < ctxt->indent_nr) {
        iVar10 = ctxt->level;
      }
      xmlOutputBufferWrite(out,iVar10 * ctxt->indent_size,buf);
    }
    xmlOutputBufferWrite(out,1,"<");
    if ((*(long *)&cur_00->compression != 0) &&
       (pcVar15 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar15 != (char *)0x0)) {
      xmlOutputBufferWriteString(out,pcVar15);
      xmlOutputBufferWrite(out,1,":");
    }
    xmlOutputBufferWriteString(out,cur_00->name);
    if (cur_00->oldNs != (xmlNsPtr)0x0) {
      xmlNsListDumpOutputCtxt(ctxt,cur_00->oldNs);
    }
    iVar10 = xmlStrEqual((xmlChar *)cur_00->name,"html");
    if (((iVar10 != 0) &&
        (lVar3._0_4_ = cur_00->compression, lVar3._4_4_ = cur_00->standalone, lVar3 == 0)) &&
       (cur_00->oldNs == (_xmlNs *)0x0)) {
      xmlOutputBufferWriteString(out," xmlns=\"http://www.w3.org/1999/xhtml\"");
    }
    p_Var16 = cur_00->extSubset;
    if (p_Var16 != (_xmlDtd *)0x0) {
      out_00 = ctxt->buf;
      p_Var2 = p_Var16->parent;
      local_40 = (_xmlDtd *)0x0;
      local_50 = (_xmlDtd *)0x0;
      local_60 = (_xmlDtd *)0x0;
      p_Var18 = (_xmlDtd *)0x0;
      for (; p_Var16 != (_xmlDtd *)0x0; p_Var16 = (_xmlDtd *)p_Var16->next) {
        p_Var17 = p_Var18;
        p_Var8 = local_40;
        if (p_Var16->notations == (void *)0x0) {
          iVar10 = xmlStrEqual(p_Var16->name,"id");
          p_Var6 = p_Var16;
          p_Var7 = local_50;
          if (iVar10 == 0) {
            if (p_Var16->notations != (void *)0x0) goto LAB_001a69bc;
            iVar10 = xmlStrEqual(p_Var16->name,"name");
            p_Var6 = local_60;
            p_Var7 = p_Var16;
            if (iVar10 != 0) goto LAB_001a6a57;
            if (p_Var16->notations != (void *)0x0) goto LAB_001a69bc;
            iVar10 = xmlStrEqual(p_Var16->name,"lang");
            p_Var7 = local_50;
            p_Var8 = p_Var16;
            if (iVar10 != 0) goto LAB_001a6a57;
            if (p_Var16->notations != (void *)0x0) goto LAB_001a69bc;
            goto LAB_001a69f4;
          }
        }
        else {
LAB_001a69bc:
          iVar10 = xmlStrEqual(p_Var16->name,"lang");
          if (((iVar10 == 0) ||
              (iVar10 = xmlStrEqual(*(xmlChar **)((long)p_Var16->notations + 0x18),"xml"),
              p_Var17 = p_Var16, p_Var6 = local_60, p_Var7 = local_50, p_Var8 = local_40,
              iVar10 == 0)) &&
             (p_Var17 = p_Var18, p_Var6 = local_60, p_Var7 = local_50, p_Var8 = local_40,
             p_Var16->notations == (void *)0x0)) {
LAB_001a69f4:
            if ((((p_Var16->children == (_xmlNode *)0x0) ||
                 (pxVar12 = p_Var16->children->content, pxVar12 == (xmlChar *)0x0)) ||
                (p_Var17 = p_Var18, p_Var6 = local_60, p_Var7 = local_50, p_Var8 = local_40,
                *pxVar12 == '\0')) &&
               (iVar10 = htmlIsBooleanAttr(p_Var16->name), p_Var17 = p_Var18, p_Var6 = local_60,
               p_Var7 = local_50, p_Var8 = local_40, iVar10 != 0)) {
              if (p_Var16->children != (xmlNodePtr)0x0) {
                xmlFreeNode(p_Var16->children);
              }
              pxVar11 = xmlNewText(p_Var16->name);
              p_Var16->children = pxVar11;
              if (pxVar11 != (xmlNodePtr)0x0) {
                pxVar11->parent = (_xmlNode *)p_Var16;
              }
            }
          }
        }
LAB_001a6a57:
        local_40 = p_Var8;
        local_50 = p_Var7;
        local_60 = p_Var6;
        xmlAttrDumpOutput(ctxt,(xmlAttrPtr)p_Var16);
        p_Var18 = p_Var17;
      }
      if ((((p_Var2 != (_xmlDoc *)0x0 && local_50 != (_xmlDtd *)0x0) && local_60 == (_xmlDtd *)0x0)
          && ((xmlChar *)p_Var2->name != (xmlChar *)0x0)) &&
         (((iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,"a"), iVar10 != 0 ||
           ((((iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,"p"), iVar10 != 0 ||
              (iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,"div"), iVar10 != 0)) ||
             (iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"img"), iVar10 != 0)) ||
            ((iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,"map"), iVar10 != 0 ||
             (iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"applet"), iVar10 != 0))))))
          || ((iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,"form"), iVar10 != 0 ||
              ((iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,"frame"), iVar10 != 0 ||
               (iVar10 = xmlStrEqual((xmlChar *)p_Var2->name,(xmlChar *)"iframe"), iVar10 != 0))))))
         )) {
        xmlOutputBufferWrite(out_00,5," id=\"");
        xmlAttrSerializeContent(out_00,(xmlAttrPtr)local_50);
        xmlOutputBufferWrite(out_00,1,"\"");
      }
      if (p_Var18 == (_xmlDtd *)0x0 && local_40 != (_xmlDtd *)0x0) {
        iVar10 = 0xb;
        pcVar15 = " xml:lang=\"";
        p_Var18 = local_40;
      }
      else {
        if (local_40 != (_xmlDtd *)0x0 || p_Var18 == (_xmlDtd *)0x0) goto LAB_001a6e08;
        iVar10 = 7;
        pcVar15 = " lang=\"";
      }
      xmlOutputBufferWrite(out_00,iVar10,pcVar15);
      xmlAttrSerializeContent(out_00,(xmlAttrPtr)p_Var18);
      xmlOutputBufferWrite(out_00,1,"\"");
    }
LAB_001a6e08:
    bVar21 = true;
    if ((((cur_00->parent == (_xmlNode *)0x0) || ((_xmlDoc *)cur_00->parent->parent != cur_00->doc))
        || (iVar10 = xmlStrEqual((xmlChar *)cur_00->name,"head"), iVar10 == 0)) ||
       (iVar10 = xmlStrEqual(cur_00->parent->name,"html"), iVar10 == 0)) {
      bVar20 = false;
    }
    else {
      pp_Var19 = &cur_00->children;
      while( true ) {
        node = *pp_Var19;
        bVar20 = node == (xmlNode *)0x0;
        if (bVar20) break;
        iVar10 = xmlStrEqual(node->name,(xmlChar *)"meta");
        if ((iVar10 != 0) &&
           (pxVar12 = xmlGetProp(node,(xmlChar *)"http-equiv"), pxVar12 != (xmlChar *)0x0)) {
          iVar10 = xmlStrcasecmp(pxVar12,(xmlChar *)"Content-Type");
          (*xmlFree)(pxVar12);
          if (iVar10 == 0) break;
        }
        pp_Var19 = &node->next;
      }
      bVar21 = node != (xmlNode *)0x0;
    }
    pp_Var19 = &cur_00->children;
    if (cur_00->children == (_xmlNode *)0x0) {
      lVar3 = *(long *)&cur_00->compression;
      if (lVar3 == 0) {
        if (cur_00->type != XML_ELEMENT_NODE) goto switchD_001a7007_caseD_64;
LAB_001a6fe5:
        pxVar12 = (xmlChar *)cur_00->name;
        switch(*pxVar12) {
        case 'a':
          pcVar15 = "area";
          break;
        case 'b':
          iVar10 = xmlStrEqual(pxVar12,"br");
          bVar22 = true;
          if ((iVar10 == 0) && (iVar10 = xmlStrEqual((xmlChar *)cur_00->name,"base"), iVar10 == 0))
          {
            pxVar12 = (xmlChar *)cur_00->name;
            pcVar15 = "basefont";
            break;
          }
          goto LAB_001a7153;
        case 'c':
          pcVar15 = "col";
          break;
        default:
          goto switchD_001a7007_caseD_64;
        case 'f':
          pcVar15 = "frame";
          break;
        case 'h':
          pcVar15 = "hr";
          break;
        case 'i':
          iVar10 = xmlStrEqual(pxVar12,(xmlChar *)"img");
          bVar22 = true;
          if ((iVar10 != 0) || (iVar10 = xmlStrEqual((xmlChar *)cur_00->name,"input"), iVar10 != 0))
          goto LAB_001a7153;
          pxVar12 = (xmlChar *)cur_00->name;
          pcVar15 = "isindex";
          break;
        case 'l':
          pcVar15 = "link";
          break;
        case 'm':
          pcVar15 = "meta";
          break;
        case 'p':
          pcVar15 = "param";
        }
        iVar10 = xmlStrEqual(pxVar12,(xmlChar *)pcVar15);
        bVar22 = iVar10 != 0;
LAB_001a7153:
        if ((bool)(bVar21 & bVar22)) {
          iVar10 = 3;
          pcVar15 = " />";
          goto LAB_001a6db2;
        }
      }
      else if (((*(long *)(lVar3 + 0x18) == 0) && (cur_00->type == XML_ELEMENT_NODE)) &&
              ((iVar10 = xmlStrEqual(*(xmlChar **)(lVar3 + 0x10),
                                     (xmlChar *)"http://www.w3.org/1999/xhtml"), iVar10 != 0 &&
               (*pp_Var19 == (_xmlNode *)0x0)))) goto LAB_001a6fe5;
switchD_001a7007_caseD_64:
      xmlOutputBufferWrite(out,1,">");
      if (bVar20) {
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(out,1,"\n");
          piVar14 = __xmlIndentTreeOutput();
          if (*piVar14 != 0) {
            iVar10 = ctxt->level + 1;
            if (ctxt->indent_nr <= ctxt->level) {
              iVar10 = ctxt->indent_nr;
            }
            xmlOutputBufferWrite(out,iVar10 * ctxt->indent_size,buf);
          }
        }
        xmlOutputBufferWriteString
                  (out,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
        if (ctxt->encoding == (xmlChar *)0x0) {
          xmlOutputBufferWrite(out,5,"UTF-8");
        }
        else {
          xmlOutputBufferWriteString(out,(char *)ctxt->encoding);
        }
        xmlOutputBufferWrite(out,4,"\" />");
        if (ctxt->format == 1) {
          xmlOutputBufferWrite(out,1,"\n");
        }
      }
      xmlOutputBufferWrite(out,2,"</");
      if ((*(long *)&cur_00->compression != 0) &&
         (pcVar15 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar15 != (char *)0x0)) {
        xmlOutputBufferWriteString(out,pcVar15);
        xmlOutputBufferWrite(out,1,":");
      }
      xmlOutputBufferWriteString(out,cur_00->name);
      iVar10 = 1;
      pcVar15 = ">";
      goto LAB_001a7290;
    }
    xmlOutputBufferWrite(out,1,">");
    if (bVar20) {
      if (ctxt->format == 1) {
        xmlOutputBufferWrite(out,1,"\n");
        piVar14 = __xmlIndentTreeOutput();
        if (*piVar14 != 0) {
          iVar10 = ctxt->level + 1;
          if (ctxt->indent_nr <= ctxt->level) {
            iVar10 = ctxt->indent_nr;
          }
          xmlOutputBufferWrite(out,iVar10 * ctxt->indent_size,buf);
        }
      }
      xmlOutputBufferWriteString
                (out,"<meta http-equiv=\"Content-Type\" content=\"text/html; charset=");
      if (ctxt->encoding == (xmlChar *)0x0) {
        xmlOutputBufferWrite(out,5,"UTF-8");
      }
      else {
        xmlOutputBufferWriteString(out,(char *)ctxt->encoding);
      }
      xmlOutputBufferWrite(out,4,"\" />");
    }
    pp_Var13 = pp_Var19;
    if (ctxt->format == 1) {
      while (p_Var4 = *pp_Var13, p_Var4 != (_xmlNode *)0x0) {
        if ((p_Var4->type == XML_ENTITY_REF_NODE) || (p_Var4->type == XML_TEXT_NODE)) {
          ctxt->format = 0;
          local_68 = cur_00;
          goto LAB_001a7079;
        }
        pp_Var13 = &p_Var4->next;
      }
      xmlOutputBufferWrite(out,1,"\n");
    }
LAB_001a7079:
    if (-1 < ctxt->level) {
      ctxt->level = ctxt->level + 1;
    }
    pxVar5 = (xmlDocPtr)*pp_Var19;
    goto LAB_001a6779;
  case XML_ATTRIBUTE_NODE:
    xmlAttrDumpOutput(ctxt,(xmlAttrPtr)cur_00);
    break;
  case XML_TEXT_NODE:
    p_Var16 = cur_00->intSubset;
    if (p_Var16 != (_xmlDtd *)0x0) {
      if ((xmlChar *)cur_00->name == "textnoenc") {
        xmlOutputBufferWriteString(out,(char *)p_Var16);
      }
      else {
        xmlOutputBufferWriteEscape(out,(xmlChar *)p_Var16,ctxt->escape);
      }
    }
    break;
  case XML_CDATA_SECTION_NODE:
    p_Var16 = cur_00->intSubset;
    if ((p_Var16 != (_xmlDtd *)0x0) &&
       (cVar9 = *(char *)&p_Var16->_private, p_Var18 = p_Var16, cVar9 != '\0')) {
      do {
        if (cVar9 == ']') {
          if ((*(char *)((long)&p_Var16->_private + 1) == ']') &&
             (*(char *)((long)&p_Var16->_private + 2) == '>')) {
            p_Var16 = (_xmlDtd *)((long)&p_Var16->_private + 2);
            xmlOutputBufferWrite(out,9,"<![CDATA[");
            xmlOutputBufferWrite(out,(int)p_Var16 - (int)p_Var18,(char *)p_Var18);
            xmlOutputBufferWrite(out,3,"]]>");
            p_Var18 = p_Var16;
          }
        }
        else if (cVar9 == '\0') goto LAB_001a6d67;
        cVar9 = *(char *)((long)&p_Var16->_private + 1);
        p_Var16 = (_xmlDtd *)((long)&p_Var16->_private + 1);
      } while( true );
    }
    iVar10 = 0xc;
    pcVar15 = "<![CDATA[]]>";
    goto LAB_001a6db2;
  case XML_ENTITY_REF_NODE:
    iVar10 = 1;
    xmlOutputBufferWrite(out,1,"&");
    xmlOutputBufferWriteString(out,cur_00->name);
    pcVar15 = ";";
    goto LAB_001a7290;
  case XML_PI_NODE:
    p_Var16 = cur_00->intSubset;
    xmlOutputBufferWrite(out,2,"<?");
    xmlOutputBufferWriteString(out,cur_00->name);
    if ((p_Var16 != (_xmlDtd *)0x0) && (cur_00->intSubset != (_xmlDtd *)0x0)) {
      xmlOutputBufferWrite(out,1," ");
      xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
    }
    iVar10 = 2;
    pcVar15 = "?>";
LAB_001a6db2:
    xmlOutputBufferWrite(out,iVar10,pcVar15);
    break;
  case XML_COMMENT_NODE:
    if (cur_00->intSubset != (_xmlDtd *)0x0) {
      xmlOutputBufferWrite(out,4,"<!--");
      xmlOutputBufferWriteString(out,(char *)cur_00->intSubset);
      iVar10 = 3;
      pcVar15 = "-->";
      goto LAB_001a7290;
    }
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    xmlDocContentDumpOutput(ctxt,cur_00);
    break;
  case XML_DOCUMENT_FRAG_NODE:
    goto switchD_001a6798_caseD_b;
  case XML_DTD_NODE:
    xmlDtdDumpOutput(ctxt,(xmlDtdPtr)cur_00);
    break;
  case XML_ELEMENT_DECL:
    xmlBufDumpElementDecl(out->buffer,(xmlElementPtr)cur_00);
    break;
  case XML_ATTRIBUTE_DECL:
    xmlBufDumpAttributeDecl(out->buffer,(xmlAttributePtr)cur_00);
    break;
  case XML_ENTITY_DECL:
    xmlBufDumpEntityDecl(out->buffer,(xmlEntityPtr)cur_00);
    break;
  case XML_NAMESPACE_DECL:
    xmlNsDumpOutputCtxt(ctxt,(xmlNsPtr)cur_00);
  }
switchD_001a6798_caseD_6:
  while( true ) {
    if (cur_00 == (xmlDocPtr)cur) {
      return;
    }
    if (ctxt->format == 1) {
      xmlOutputBufferWrite(out,1,"\n");
    }
    pxVar5 = (xmlDocPtr)cur_00->next;
    if ((xmlDocPtr)cur_00->next != (xmlDocPtr)0x0) break;
    cur_00 = (xmlDocPtr)cur_00->parent;
    if (cur_00 == (xmlDocPtr)0x0) {
      return;
    }
    if (cur_00->type == XML_ELEMENT_NODE) {
      if (0 < ctxt->level) {
        ctxt->level = ctxt->level + -1;
      }
      piVar14 = __xmlIndentTreeOutput();
      if ((*piVar14 != 0) && (ctxt->format == 1)) {
        iVar10 = ctxt->indent_nr;
        if (ctxt->level < ctxt->indent_nr) {
          iVar10 = ctxt->level;
        }
        xmlOutputBufferWrite(out,iVar10 * ctxt->indent_size,buf);
      }
      xmlOutputBufferWrite(out,2,"</");
      if ((*(long *)&cur_00->compression != 0) &&
         (pcVar15 = *(char **)(*(long *)&cur_00->compression + 0x18), pcVar15 != (char *)0x0)) {
        xmlOutputBufferWriteString(out,pcVar15);
        xmlOutputBufferWrite(out,1,":");
      }
      xmlOutputBufferWriteString(out,cur_00->name);
      xmlOutputBufferWrite(out,1,">");
      if (cur_00 == local_68) {
        ctxt->format = iVar1;
        local_68 = (xmlDocPtr)0x0;
      }
    }
  }
  goto LAB_001a6779;
switchD_001a6798_caseD_b:
  pxVar5 = (xmlDocPtr)cur_00->children;
  if ((xmlDocPtr)cur_00->children != (xmlDocPtr)0x0) goto LAB_001a6779;
  goto switchD_001a6798_caseD_6;
LAB_001a6d67:
  if (p_Var18 != p_Var16) {
    xmlOutputBufferWrite(out,9,"<![CDATA[");
    xmlOutputBufferWriteString(out,(char *)p_Var18);
    iVar10 = 3;
    pcVar15 = "]]>";
LAB_001a7290:
    xmlOutputBufferWrite(out,iVar10,pcVar15);
  }
  goto switchD_001a6798_caseD_6;
}

Assistant:

static void
xhtmlNodeDumpOutput(xmlSaveCtxtPtr ctxt, xmlNodePtr cur) {
    int format = ctxt->format, addmeta;
    xmlNodePtr tmp, root, unformattedNode = NULL;
    xmlChar *start, *end;
    xmlOutputBufferPtr buf = ctxt->buf;

    if (cur == NULL) return;

    root = cur;
    while (1) {
        switch (cur->type) {
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            xmlDocContentDumpOutput(ctxt, (xmlDocPtr) cur);
	    break;

        case XML_NAMESPACE_DECL:
	    xmlNsDumpOutputCtxt(ctxt, (xmlNsPtr) cur);
	    break;

        case XML_DTD_NODE:
            xmlDtdDumpOutput(ctxt, (xmlDtdPtr) cur);
	    break;

        case XML_DOCUMENT_FRAG_NODE:
            if (cur->children) {
                cur = cur->children;
                continue;
            }
            break;

        case XML_ELEMENT_DECL:
            xmlBufDumpElementDecl(buf->buffer, (xmlElementPtr) cur);
	    break;

        case XML_ATTRIBUTE_DECL:
            xmlBufDumpAttributeDecl(buf->buffer, (xmlAttributePtr) cur);
	    break;

        case XML_ENTITY_DECL:
            xmlBufDumpEntityDecl(buf->buffer, (xmlEntityPtr) cur);
	    break;

        case XML_ELEMENT_NODE:
            addmeta = 0;

	    if ((cur != root) && (ctxt->format == 1) && (xmlIndentTreeOutput))
		xmlOutputBufferWrite(buf, ctxt->indent_size *
				     (ctxt->level > ctxt->indent_nr ?
				      ctxt->indent_nr : ctxt->level),
				     ctxt->indent);

            xmlOutputBufferWrite(buf, 1, "<");
            if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
                xmlOutputBufferWrite(buf, 1, ":");
            }

            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            if (cur->nsDef)
                xmlNsListDumpOutputCtxt(ctxt, cur->nsDef);
            if ((xmlStrEqual(cur->name, BAD_CAST "html") &&
                (cur->ns == NULL) && (cur->nsDef == NULL))) {
                /*
                 * 3.1.1. Strictly Conforming Documents A.3.1.1 3/
                 */
                xmlOutputBufferWriteString(buf,
                        " xmlns=\"http://www.w3.org/1999/xhtml\"");
            }
            if (cur->properties != NULL)
                xhtmlAttrListDumpOutput(ctxt, cur->properties);

            if ((cur->parent != NULL) &&
                (cur->parent->parent == (xmlNodePtr) cur->doc) &&
                xmlStrEqual(cur->name, BAD_CAST"head") &&
                xmlStrEqual(cur->parent->name, BAD_CAST"html")) {

                tmp = cur->children;
                while (tmp != NULL) {
                    if (xmlStrEqual(tmp->name, BAD_CAST"meta")) {
                        xmlChar *httpequiv;

                        httpequiv = xmlGetProp(tmp, BAD_CAST"http-equiv");
                        if (httpequiv != NULL) {
                            if (xmlStrcasecmp(httpequiv,
                                        BAD_CAST"Content-Type") == 0) {
                                xmlFree(httpequiv);
                                break;
                            }
                            xmlFree(httpequiv);
                        }
                    }
                    tmp = tmp->next;
                }
                if (tmp == NULL)
                    addmeta = 1;
            }

            if (cur->children == NULL) {
                if (((cur->ns == NULL) || (cur->ns->prefix == NULL)) &&
                    ((xhtmlIsEmpty(cur) == 1) && (addmeta == 0))) {
                    /*
                     * C.2. Empty Elements
                     */
                    xmlOutputBufferWrite(buf, 3, " />");
                } else {
                    if (addmeta == 1) {
                        xmlOutputBufferWrite(buf, 1, ">");
                        if (ctxt->format == 1) {
                            xmlOutputBufferWrite(buf, 1, "\n");
                            if (xmlIndentTreeOutput)
                                xmlOutputBufferWrite(buf, ctxt->indent_size *
                                    (ctxt->level + 1 > ctxt->indent_nr ?
                                    ctxt->indent_nr : ctxt->level + 1),
                                    ctxt->indent);
                        }
                        xmlOutputBufferWriteString(buf,
                                "<meta http-equiv=\"Content-Type\" "
                                "content=\"text/html; charset=");
                        if (ctxt->encoding) {
                            xmlOutputBufferWriteString(buf,
                                    (const char *)ctxt->encoding);
                        } else {
                            xmlOutputBufferWrite(buf, 5, "UTF-8");
                        }
                        xmlOutputBufferWrite(buf, 4, "\" />");
                        if (ctxt->format == 1)
                            xmlOutputBufferWrite(buf, 1, "\n");
                    } else {
                        xmlOutputBufferWrite(buf, 1, ">");
                    }
                    /*
                     * C.3. Element Minimization and Empty Element Content
                     */
                    xmlOutputBufferWrite(buf, 2, "</");
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)cur->ns->prefix);
                        xmlOutputBufferWrite(buf, 1, ":");
                    }
                    xmlOutputBufferWriteString(buf, (const char *)cur->name);
                    xmlOutputBufferWrite(buf, 1, ">");
                }
            } else {
                xmlOutputBufferWrite(buf, 1, ">");
                if (addmeta == 1) {
                    if (ctxt->format == 1) {
                        xmlOutputBufferWrite(buf, 1, "\n");
                        if (xmlIndentTreeOutput)
                            xmlOutputBufferWrite(buf, ctxt->indent_size *
                                (ctxt->level + 1 > ctxt->indent_nr ?
                                ctxt->indent_nr : ctxt->level + 1),
                                ctxt->indent);
                    }
                    xmlOutputBufferWriteString(buf,
                            "<meta http-equiv=\"Content-Type\" "
                            "content=\"text/html; charset=");
                    if (ctxt->encoding) {
                        xmlOutputBufferWriteString(buf,
                                (const char *)ctxt->encoding);
                    } else {
                        xmlOutputBufferWrite(buf, 5, "UTF-8");
                    }
                    xmlOutputBufferWrite(buf, 4, "\" />");
                }

                if (ctxt->format == 1) {
                    tmp = cur->children;
                    while (tmp != NULL) {
                        if ((tmp->type == XML_TEXT_NODE) ||
                            (tmp->type == XML_ENTITY_REF_NODE)) {
                            unformattedNode = cur;
                            ctxt->format = 0;
                            break;
                        }
                        tmp = tmp->next;
                    }
                }

                if (ctxt->format == 1) xmlOutputBufferWrite(buf, 1, "\n");
                if (ctxt->level >= 0) ctxt->level++;
                cur = cur->children;
                continue;
            }

            break;

        case XML_TEXT_NODE:
	    if (cur->content == NULL)
                break;
	    if ((cur->name == xmlStringText) ||
		(cur->name != xmlStringTextNoenc)) {
                xmlOutputBufferWriteEscape(buf, cur->content, ctxt->escape);
	    } else {
		/*
		 * Disable escaping, needed for XSLT
		 */
		xmlOutputBufferWriteString(buf, (const char *) cur->content);
	    }
	    break;

        case XML_PI_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                if (cur->content != NULL) {
                    xmlOutputBufferWrite(buf, 1, " ");
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->content);
                }
                xmlOutputBufferWrite(buf, 2, "?>");
            } else {
                xmlOutputBufferWrite(buf, 2, "<?");
                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 2, "?>");
            }
            break;

        case XML_COMMENT_NODE:
            if (cur->content != NULL) {
                xmlOutputBufferWrite(buf, 4, "<!--");
                xmlOutputBufferWriteString(buf, (const char *)cur->content);
                xmlOutputBufferWrite(buf, 3, "-->");
            }
            break;

        case XML_ENTITY_REF_NODE:
            xmlOutputBufferWrite(buf, 1, "&");
            xmlOutputBufferWriteString(buf, (const char *)cur->name);
            xmlOutputBufferWrite(buf, 1, ";");
            break;

        case XML_CDATA_SECTION_NODE:
            if (cur->content == NULL || *cur->content == '\0') {
                xmlOutputBufferWrite(buf, 12, "<![CDATA[]]>");
            } else {
                start = end = cur->content;
                while (*end != '\0') {
                    if (*end == ']' && *(end + 1) == ']' &&
                        *(end + 2) == '>') {
                        end = end + 2;
                        xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                        xmlOutputBufferWrite(buf, end - start,
                                (const char *)start);
                        xmlOutputBufferWrite(buf, 3, "]]>");
                        start = end;
                    }
                    end++;
                }
                if (start != end) {
                    xmlOutputBufferWrite(buf, 9, "<![CDATA[");
                    xmlOutputBufferWriteString(buf, (const char *)start);
                    xmlOutputBufferWrite(buf, 3, "]]>");
                }
            }
            break;

        case XML_ATTRIBUTE_NODE:
            xmlAttrDumpOutput(ctxt, (xmlAttrPtr) cur);
	    break;

        default:
            break;
        }

        while (1) {
            if (cur == root)
                return;
            if (ctxt->format == 1)
                xmlOutputBufferWrite(buf, 1, "\n");
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }

            /*
             * The parent should never be NULL here but we want to handle
             * corrupted documents gracefully.
             */
            if (cur->parent == NULL)
                return;
            cur = cur->parent;

            if (cur->type == XML_ELEMENT_NODE) {
                if (ctxt->level > 0) ctxt->level--;
                if ((xmlIndentTreeOutput) && (ctxt->format == 1))
                    xmlOutputBufferWrite(buf, ctxt->indent_size *
                                         (ctxt->level > ctxt->indent_nr ?
                                          ctxt->indent_nr : ctxt->level),
                                         ctxt->indent);

                xmlOutputBufferWrite(buf, 2, "</");
                if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                    xmlOutputBufferWriteString(buf,
                            (const char *)cur->ns->prefix);
                    xmlOutputBufferWrite(buf, 1, ":");
                }

                xmlOutputBufferWriteString(buf, (const char *)cur->name);
                xmlOutputBufferWrite(buf, 1, ">");

                if (cur == unformattedNode) {
                    ctxt->format = format;
                    unformattedNode = NULL;
                }
            }
        }
    }
}